

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O3

void __thiscall
PlatformWindowData::loop<std::function<void()>&>(PlatformWindowData *this,function<void_()> *step)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  Display *pDVar6;
  char *__format;
  undefined8 *puVar7;
  byte bVar8;
  uint uVar9;
  bool wasResize;
  XEvent e;
  XEvent in_stack_fffffffffffffd58;
  Atom local_1e8;
  long local_1d0;
  Atom local_1c8;
  Size2D local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  Display *pDStack_1a0;
  Window local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  Atom AStack_180;
  int local_f0 [2];
  undefined8 local_e8;
  int local_e0;
  Atom local_c8;
  Atom local_b8;
  
  bVar8 = 0;
  lVar3 = std::chrono::_V2::system_clock::now();
  puts("Entering event loop");
  XMoveResizeWindow(this->display,this->handle,(this->last_pos).x,(this->last_pos).y,
                    (this->last_size).w,(this->last_size).h);
  local_1c8 = 0;
  local_1e8 = 0;
  local_1d0 = lVar3;
  do {
    pDVar6 = this->display;
    if (this->eventDriven == false) {
      while (iVar2 = XEventsQueued(pDVar6,0), 0 < iVar2) {
        XNextEvent(this->display,local_f0);
        if (local_f0[0] == 0x21) {
          if (local_e0 == 0) {
            printf("[%zi] Not sent CM ",local_e8);
          }
          if (local_c8 == this->AWM_PROTOCOLS) {
            if (local_b8 == this->AWM_DELETE_WINDOW) {
              this->isQuit = true;
              if (MainWindowDetails::relay._104_8_ == 0) goto LAB_0010ebfe;
              (*(code *)MainWindowDetails::relay._112_8_)(0x115340);
              break;
            }
            __format = "Unknown protocol message %zi\n";
          }
          else {
            if (local_c8 == 0x67932) {
              local_1c8 = local_b8;
              goto LAB_0010e9ef;
            }
            __format = "Other Atom %zi ";
          }
          printf(__format);
        }
        else {
          local_1b8 = (Size2D)((ulong)local_1b8 & 0xffffffffffffff00);
          uVar9 = (this->size).w;
          uVar1 = (this->size).h;
          piVar5 = local_f0;
          puVar7 = (undefined8 *)&stack0xfffffffffffffd58;
          for (lVar4 = 0x18; lVar4 != 0; lVar4 = lVar4 + -1) {
            *puVar7 = *(undefined8 *)piVar5;
            piVar5 = piVar5 + ((ulong)bVar8 * -2 + 1) * 2;
            puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
          }
          MainWindowDetails::Proc
                    ((Display *)(ulong)uVar9,(Window *)(ulong)uVar1,in_stack_fffffffffffffd58,
                     &local_1b8,(bool *)0x0);
          if ((char)local_1b8.w == '\x01') {
            this->isResizing = true;
            lVar3 = std::chrono::_V2::system_clock::now();
          }
        }
LAB_0010e9ef:
        pDVar6 = this->display;
      }
    }
    else {
      XNextEvent(pDVar6,local_f0);
      if (((local_f0[0] == 0x21) && (local_c8 == this->AWM_PROTOCOLS)) &&
         (local_b8 == this->AWM_DELETE_WINDOW)) {
        this->isQuit = true;
        if (MainWindowDetails::relay._104_8_ != 0) {
          (*(code *)MainWindowDetails::relay._112_8_)(0x115340);
          return;
        }
        goto LAB_0010ebfe;
      }
      uVar9 = (this->size).w;
      uVar1 = (this->size).h;
      piVar5 = local_f0;
      puVar7 = (undefined8 *)&stack0xfffffffffffffd58;
      for (lVar4 = 0x18; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar7 = *(undefined8 *)piVar5;
        piVar5 = piVar5 + ((ulong)bVar8 * -2 + 1) * 2;
        puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
      }
      MainWindowDetails::Proc
                ((Display *)(ulong)uVar9,(Window *)(ulong)uVar1,in_stack_fffffffffffffd58,
                 (Size2D *)&this->isResizing,(bool *)0x0);
    }
    this->needRedraw = true;
    lVar4 = std::chrono::_V2::system_clock::now();
    if ((double)((lVar4 - lVar3) / 1000) / 1000.0 <= 300.0) {
      if ((this->needRedraw & 1U) != 0) goto LAB_0010ea02;
    }
    else {
      this->needRedraw = true;
      this->isResizing = false;
LAB_0010ea02:
      uVar9 = 0x406f4000;
      if (((this->eventDriven | this->isResizing) & 1U) == 0) {
        uVar9 = 0x3ff00000;
      }
      lVar4 = std::chrono::_V2::system_clock::now();
      if ((double)((ulong)uVar9 << 0x20) < (double)((lVar4 - local_1d0) / 1000) / 1000.0) {
        if ((this->eventDriven == false) && (local_1e8 == local_1c8)) {
          if ((step->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0010ebfe:
            std::__throw_bad_function_call();
          }
          (*step->_M_invoker)((_Any_data *)step);
          uStack_1b0 = 0;
          local_188 = 0;
          AStack_180 = 0;
          uStack_190 = 0;
          local_1b8.w = 0xc;
          local_1b8.h = 0;
          local_1a8 = 1;
          pDStack_1a0 = this->display;
          local_198 = this->handle;
          XSendEvent(pDStack_1a0,local_198,0,0,&local_1b8);
          local_1e8 = local_1e8 + 1;
          memset(&local_1b8,0,0xc0);
          local_1b8.w = 0x21;
          local_188 = CONCAT44(local_188._4_4_,0x20);
          local_198 = this->handle;
          uStack_190 = 0x67932;
          AStack_180 = local_1e8;
          XSendEvent(this->display,local_198,0,0,&local_1b8);
          XSync(this->display);
        }
        this->needRedraw = false;
        local_1d0 = lVar4;
      }
    }
    if (this->isQuit != false) {
      return;
    }
  } while( true );
}

Assistant:

void loop(F&& step)
	{
		auto t0 = std::chrono::high_resolution_clock::now();
		auto t1 = t0, trsz = t0;
		printf("Entering event loop\n");
		long nredraw = 0, nredrawproc = 0;

		auto sendExposeEvent = [&]()
		{
			XExposeEvent xee{};
			xee.type = Expose;
			xee.send_event = True;
			xee.display = display;
			xee.window = handle;
			XSendEvent(display, handle, False, NoEventMask, (XEvent*)&xee);
		};

		//Reposition the window, because some WMs move the window initially despite the x, y, set in create window.
		XMoveResizeWindow(display, handle, last_pos.x, last_pos.y, last_size.w, last_size.h);
		while(true)
		{
			XEvent e;
			if(eventDriven)
			{
				XNextEvent(display, &e);
				if(e.type == ClientMessage && e.xclient.message_type == AWM_PROTOCOLS && (Atom)(e.xclient.data.l[0]) == AWM_DELETE_WINDOW){ isQuit = true; MainWindowDetails::relay.onExit(); break; }
				else{ MainWindowDetails::Proc(display, handle, e, size, isResizing); }
				//step();
				//printf("while 1\n");
				needRedraw = true;
			}
			else
			{
				//auto res = True;
				//while(res == True && !isQuit)
				{
					while(XEventsQueued(display, QueuedAlready) > 0)
					{
						XNextEvent(display, &e);
						if(e.type == ClientMessage)
						{
							if(e.xclient.send_event){ /*printf("[%zi] Sent CM ", e.xclient.serial);*/ }
							else{ printf("[%zi] Not sent CM ", e.xclient.serial); }

							if(e.xclient.message_type == AWM_PROTOCOLS)
							{
								//printf("WM_PROTOCOLS ");
								if( (Atom)(e.xclient.data.l[0]) == AWM_DELETE_WINDOW){ /*printf("AWM_DELETE_WINDOW\n");*/ isQuit = true; MainWindowDetails::relay.onExit(); break; }
								else{ printf("Unknown protocol message %zi\n", e.xclient.data.l[0]); }
							}
							else if(e.xclient.message_type == 424242){ nredrawproc = e.xclient.data.l[0]; /*printf("Redraw processed: %zi\n", nredrawproc);*/ }
							else{ printf("Other Atom %zi ", e.xclient.message_type); }
						}
						else
						{
							bool wasResize = false;
							MainWindowDetails::Proc(display, handle, e, size, wasResize);
							if(wasResize){ isResizing = true; trsz = std::chrono::high_resolution_clock::now(); }
						}
					}
					needRedraw = true;
				}
			}

			if(std::chrono::duration_cast<std::chrono::microseconds>(std::chrono::high_resolution_clock::now()-trsz).count()/1000.0 > 300.0)
			{
				//printf("isResizing = false\n");
				isResizing = false;
				needRedraw = true;
			}

			if(needRedraw)
			{
				double limit = (isResizing || eventDriven) ? 250.0 : 1.0;
				t1 = std::chrono::high_resolution_clock::now();
				auto dt = std::chrono::duration_cast<std::chrono::microseconds>(t1-t0).count()/1000.0;
				if(dt > limit)
				{
					if(eventDriven){ /*printf("limited redraw, expose event, dt = %f\n", dt); sendExposeEvent();*//*XClearArea(display, handle, 0, 0, 1, 1, true);*/ }
					else if(!eventDriven && (nredraw == nredrawproc))
					{
						step();
						sendExposeEvent();//XClearArea(display, handle, 0, 0, 1, 1, true);
						nredraw += 1;
						XEvent ev{0};
						ev.type = ClientMessage;
						ev.xclient.format = 32;
						ev.xclient.window = handle;
						ev.xclient.message_type = 424242;
						ev.xclient.data.l[0] = nredraw;
						XSendEvent(display, handle, False, NoEventMask, &ev);
						XSync(display, False);
						//XFlush(display);
					}
					t0 = t1;
					needRedraw = false;
				}
			}
			//
			//
			if(isQuit){ break; }
		}
	}